

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O2

int readDisplacement(InternalInstruction *insn)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  undefined8 uStack_38;
  
  if (insn->consumedDisplacement != false) {
    return 0;
  }
  insn->consumedDisplacement = true;
  insn->displacementOffset = (char)(int)insn->readerCursor - (char)(int)insn->startLocation;
  iVar1 = 0;
  uStack_38 = in_RAX;
  switch(insn->eaDisplacement) {
  case EA_DISP_NONE:
    insn->consumedDisplacement = false;
    iVar1 = 0;
    break;
  case EA_DISP_8:
    bVar3 = true;
    bVar4 = 0;
    iVar1 = -1;
    do {
      if (!bVar3) {
        insn->readerCursor = insn->readerCursor + 1;
        lVar6 = (long)(char)bVar4;
        goto LAB_0021bb10;
      }
      iVar2 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)((long)&uStack_38 + 5),
                              insn->readerCursor);
      bVar4 = bVar4 | uStack_38._5_1_;
      bVar3 = false;
    } while (iVar2 == 0);
    break;
  case EA_DISP_16:
    bVar4 = 0;
    uVar5 = 0;
    for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
      iVar1 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)((long)&uStack_38 + 6),
                              insn->readerCursor + lVar6);
      if (iVar1 != 0) {
        return -1;
      }
      uVar5 = uVar5 | (uint)uStack_38._6_1_ << (bVar4 & 0x3f);
      bVar4 = bVar4 + 8;
    }
    insn->readerCursor = insn->readerCursor + 2;
    lVar6 = (long)(short)uVar5;
    goto LAB_0021bb10;
  case EA_DISP_32:
    bVar4 = 0;
    uVar5 = 0;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      iVar1 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)((long)&uStack_38 + 7),
                              insn->readerCursor + lVar6);
      if (iVar1 != 0) {
        return -1;
      }
      uVar5 = uVar5 | (uint)uStack_38._7_1_ << (bVar4 & 0x3f);
      bVar4 = bVar4 + 8;
    }
    insn->readerCursor = insn->readerCursor + 4;
    lVar6 = (long)(int)uVar5;
LAB_0021bb10:
    insn->displacement = lVar6;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int readDisplacement(struct InternalInstruction *insn)
{
	int8_t d8;
	int16_t d16;
	int32_t d32;

	// dbgprintf(insn, "readDisplacement()");

	if (insn->consumedDisplacement)
		return 0;

	insn->consumedDisplacement = true;
	insn->displacementOffset = (uint8_t)(insn->readerCursor - insn->startLocation);

	switch (insn->eaDisplacement) {
		case EA_DISP_NONE:
			insn->consumedDisplacement = false;
			break;
		case EA_DISP_8:
			if (consumeInt8(insn, &d8))
				return -1;
			insn->displacement = d8;
			break;
		case EA_DISP_16:
			if (consumeInt16(insn, &d16))
				return -1;
			insn->displacement = d16;
			break;
		case EA_DISP_32:
			if (consumeInt32(insn, &d32))
				return -1;
			insn->displacement = d32;
			break;
	}

	return 0;
}